

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_collation_needed16
              (sqlite3 *db,void *pCollNeededArg,
              _func_void_void_ptr_sqlite3_ptr_int_void_ptr *xCollNeeded16)

{
  if (db->mutex == (sqlite3_mutex *)0x0) {
    db->xCollNeeded = (_func_void_void_ptr_sqlite3_ptr_int_char_ptr *)0x0;
    db->xCollNeeded16 = xCollNeeded16;
    db->pCollNeededArg = pCollNeededArg;
  }
  else {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
    db->xCollNeeded = (_func_void_void_ptr_sqlite3_ptr_int_char_ptr *)0x0;
    db->xCollNeeded16 = xCollNeeded16;
    db->pCollNeededArg = pCollNeededArg;
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
    }
  }
  return 0;
}

Assistant:

SQLITE_API int sqlite3_collation_needed16(
  sqlite3 *db, 
  void *pCollNeededArg, 
  void(*xCollNeeded16)(void*,sqlite3*,int eTextRep,const void*)
){
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ) return SQLITE_MISUSE_BKPT;
#endif
  sqlite3_mutex_enter(db->mutex);
  db->xCollNeeded = 0;
  db->xCollNeeded16 = xCollNeeded16;
  db->pCollNeededArg = pCollNeededArg;
  sqlite3_mutex_leave(db->mutex);
  return SQLITE_OK;
}